

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall
SchnorrSig_ComputeSigPoint_Test::~SchnorrSig_ComputeSigPoint_Test
          (SchnorrSig_ComputeSigPoint_Test *this)

{
  SchnorrSig_ComputeSigPoint_Test *this_local;
  
  ~SchnorrSig_ComputeSigPoint_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(SchnorrSig, ComputeSigPoint) {
  std::string expected_sig_point =
      "03735acf82eef9da1540efb07a68251d5476dabb11ac77054924eccbb4121885e8";

  SchnorrPubkey schnorr_nonce(
      "f14d7e54ff58c5d019ce9986be4a0e8b7d643bd08ef2cdf1099e1a457865b547");

  auto point = SchnorrUtil::ComputeSigPoint(msg, schnorr_nonce, pubkey);

  EXPECT_EQ(expected_sig_point, point.GetHex());
}